

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O3

void __thiscall Simulator::dumpHistory(Simulator *this)

{
  pointer pbVar1;
  uint uVar2;
  ulong uVar3;
  ofstream ofile;
  string local_240;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream((ostream *)&local_220,"dump.txt",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"---------Execution History--------\n",0x23);
  pbVar1 = (this->history).inst_record.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->history).inst_record.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,pbVar1[uVar3]._M_dataplus._M_p,pbVar1[uVar3]._M_string_length
                );
      pbVar1 = (this->history).reg_record.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,pbVar1[uVar3]._M_dataplus._M_p,pbVar1[uVar3]._M_string_length
                );
      pbVar1 = (this->history).inst_record.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < (ulong)((long)(this->history).inst_record.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"\n---------Memory Dump---------------\n",0x25);
  MemoryManager::dumpMemory_abi_cxx11_(&local_240,this->memory);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,local_240._M_dataplus._M_p,local_240._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220 + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void Simulator::dumpHistory() {
    std::ofstream ofile("dump.txt");
    ofile << "---------Execution History--------\n";
    for (uint32_t i = 0; i < this->history.inst_record.size(); i++) {
        ofile << this->history.inst_record[i];
        ofile << this->history.reg_record[i];
    }
    ofile << "\n---------Memory Dump---------------\n";
    ofile << memory->dumpMemory();
    ofile << std::endl;

    ofile.close();
}